

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument.cpp
# Opt level: O2

SFInstrument * __thiscall sf2cute::SFInstrument::operator=(SFInstrument *this,SFInstrument *origin)

{
  vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
  *this_00;
  SFInstrumentZone *pSVar1;
  pointer puVar2;
  unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_> uVar3;
  __uniq_ptr_data<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>,_true,_true>
  in_RAX;
  pointer *__ptr;
  pointer puVar4;
  _Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false> local_38;
  
  pSVar1 = (this->global_zone_)._M_t.
           super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
           ._M_t.
           super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
           .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl;
  (this->global_zone_)._M_t.
  super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>.
  _M_t.
  super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
  .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl = (SFInstrumentZone *)0x0;
  local_38._M_head_impl =
       (SFInstrumentZone *)
       in_RAX.
       super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
       ._M_t.
       super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
       .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl;
  if (pSVar1 != (SFInstrumentZone *)0x0) {
    (**(code **)((long)(pSVar1->super_SFZone)._vptr_SFZone + 8))();
  }
  if ((origin->global_zone_)._M_t.
      super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
      ._M_t.
      super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
      .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl !=
      (SFInstrumentZone *)0x0) {
    std::make_unique<sf2cute::SFInstrumentZone,sf2cute::SFInstrumentZone&>
              ((SFInstrumentZone *)&stack0xffffffffffffffc8);
    uVar3._M_t.
    super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
    ._M_t.
    super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
    .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl =
         (__uniq_ptr_data<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>,_true,_true>
          )(__uniq_ptr_data<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>,_true,_true>
            )local_38._M_head_impl;
    local_38._M_head_impl = (SFInstrumentZone *)0x0;
    pSVar1 = (this->global_zone_)._M_t.
             super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
             ._M_t.
             super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
             .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl;
    (this->global_zone_)._M_t.
    super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
    ._M_t.
    super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
    .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl =
         (SFInstrumentZone *)
         uVar3._M_t.
         super___uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
         ._M_t.
         super__Tuple_impl<0UL,_sf2cute::SFInstrumentZone_*,_std::default_delete<sf2cute::SFInstrumentZone>_>
         .super__Head_base<0UL,_sf2cute::SFInstrumentZone_*,_false>._M_head_impl;
    if (pSVar1 != (SFInstrumentZone *)0x0) {
      (**(code **)((long)(pSVar1->super_SFZone)._vptr_SFZone + 8))();
      if (local_38._M_head_impl != (SFInstrumentZone *)0x0) {
        (**(code **)(*(long *)local_38._M_head_impl + 8))();
      }
    }
  }
  this_00 = &this->zones_;
  std::
  vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
  ::clear(this_00);
  std::
  vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
  ::reserve(this_00,(long)(origin->zones_).
                          super__Vector_base<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(origin->zones_).
                          super__Vector_base<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar2 = (origin->zones_).
           super__Vector_base<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (origin->zones_).
                super__Vector_base<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar2; puVar4 = puVar4 + 1) {
    std::make_unique<sf2cute::SFInstrumentZone,sf2cute::SFInstrumentZone&>
              ((SFInstrumentZone *)&stack0xffffffffffffffc8);
    std::
    vector<std::unique_ptr<sf2cute::SFInstrumentZone,std::default_delete<sf2cute::SFInstrumentZone>>,std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,std::default_delete<sf2cute::SFInstrumentZone>>>>
    ::
    emplace_back<std::unique_ptr<sf2cute::SFInstrumentZone,std::default_delete<sf2cute::SFInstrumentZone>>>
              ((vector<std::unique_ptr<sf2cute::SFInstrumentZone,std::default_delete<sf2cute::SFInstrumentZone>>,std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,std::default_delete<sf2cute::SFInstrumentZone>>>>
                *)this_00,
               (unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
                *)&stack0xffffffffffffffc8);
    if (local_38._M_head_impl != (SFInstrumentZone *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
  }
  std::__cxx11::string::_M_assign((string *)this);
  this->parent_file_ = (SoundFont *)0x0;
  SetBackwardReferences(this);
  return this;
}

Assistant:

SFInstrument & SFInstrument::operator=(const SFInstrument & origin) {
  // Copy global zone.
  global_zone_ = nullptr;
  if (origin.has_global_zone()) {
    global_zone_ = std::make_unique<SFInstrumentZone>(origin.global_zone());
  }

  // Copy instrument zones.
  zones_.clear();
  zones_.reserve(origin.zones().size());
  for (const auto & zone : origin.zones()) {
    zones_.push_back(std::make_unique<SFInstrumentZone>(*zone));
  }

  // Copy other fields.
  name_ = origin.name_;
  parent_file_ = nullptr;

  // Repair references.
  SetBackwardReferences();

  return *this;
}